

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

void Abc_ConvertAigToGia_rec1(Gia_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Gia_Obj_t *pFanout;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x3a7,"void Abc_ConvertAigToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) != 4) {
    return;
  }
  Abc_ConvertAigToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
  Abc_ConvertAigToGia_rec1(p,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
  uVar12 = 0xffffffff;
  uVar11 = 0xffffffff;
  puVar5 = (uint *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  if (puVar5 != (uint *)0x0) {
    uVar11 = *puVar5;
    if ((int)uVar11 < 0) goto LAB_00845a5b;
    uVar11 = uVar11 ^ (uint)pObj->pFanin0 & 1;
  }
  puVar5 = (uint *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  if (puVar5 != (uint *)0x0) {
    uVar12 = *puVar5;
    if ((int)uVar12 < 0) {
LAB_00845a5b:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar12 = uVar12 ^ (uint)pObj->pFanin1 & 1;
  }
  if (p->fGiaSimple == 0) {
    uVar4 = uVar12;
    if ((int)uVar11 < 2) {
      if (uVar11 == 0) {
        uVar4 = uVar11;
      }
      goto LAB_00845994;
    }
    if ((int)uVar12 < 2) {
      uVar4 = uVar11;
      if (uVar12 == 0) {
        uVar4 = uVar12;
      }
      goto LAB_00845994;
    }
    if ((uVar11 == uVar12) || (uVar4 = 0, (uVar12 ^ uVar11) == 1)) goto LAB_00845994;
  }
  pFanout = Gia_ManAppendObj(p);
  if ((int)uVar11 < 0) {
LAB_00845a1d:
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  uVar4 = uVar11 >> 1;
  iVar1 = p->nObjs;
  if (iVar1 <= (int)uVar4) goto LAB_00845a1d;
  if (((int)uVar12 < 0) || (uVar3 = uVar12 >> 1, iVar1 <= (int)uVar3)) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if ((uVar4 == uVar3) && (p->fGiaSimple == 0)) {
    __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  pGVar2 = p->pObjs;
  iVar8 = (int)pFanout;
  if ((int)uVar11 < (int)uVar12) {
    if (pGVar2 + iVar1 <= pFanout || pFanout < pGVar2) goto LAB_008459df;
    uVar7 = *(ulong *)pFanout;
    uVar9 = (ulong)((uVar11 & 1) << 0x1d |
                   ((uint)(iVar8 - (int)pGVar2) >> 2) * -0x55555555 - uVar4 & 0x1fffffff);
    *(ulong *)pFanout = uVar9 | uVar7 & 0xffffffffc0000000;
    pGVar2 = p->pObjs;
    if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_008459df;
    uVar6 = (ulong)(((uint)(iVar8 - (int)pGVar2) >> 2) * -0x55555555 - uVar3 & 0x1fffffff) << 0x20;
    *(ulong *)pFanout = uVar9 | uVar7 & 0xe0000000c0000000 | uVar6;
    uVar13 = (ulong)(uVar12 & 1) << 0x3d;
    uVar6 = uVar9 | uVar7 & 0xc0000000c0000000 | uVar6;
  }
  else {
    if (pGVar2 + iVar1 <= pFanout || pFanout < pGVar2) goto LAB_008459df;
    uVar7 = *(ulong *)pFanout;
    uVar9 = (ulong)(((uint)(iVar8 - (int)pGVar2) >> 2) * -0x55555555 - uVar4 & 0x1fffffff) << 0x20;
    uVar10 = (ulong)(uVar11 & 1) << 0x3d;
    *(ulong *)pFanout = uVar10 | uVar7 & 0xc0000000ffffffff | uVar9;
    pGVar2 = p->pObjs;
    if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_008459df;
    uVar6 = (ulong)(((uint)(iVar8 - (int)pGVar2) >> 2) * -0x55555555 - uVar3 & 0x1fffffff);
    *(ulong *)pFanout = uVar10 | uVar7 & 0xc0000000e0000000 | uVar9 | uVar6;
    uVar13 = (ulong)((uVar12 & 1) << 0x1d);
    uVar6 = uVar10 | uVar7 & 0xc0000000c0000000 | uVar9 | uVar6;
  }
  *(ulong *)pFanout = uVar6 | uVar13;
  if (p->pFanData != (int *)0x0) {
    Gia_ObjAddFanout(p,pFanout + -(uVar6 & 0x1fffffff),pFanout);
    Gia_ObjAddFanout(p,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout);
  }
  if (p->fSweeper != 0) {
    uVar9 = *(ulong *)pFanout & 0x1fffffff;
    uVar7 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
    uVar10 = 0x4000000000000000;
    uVar6 = 0x4000000000000000;
    if (((uint)*(ulong *)(pFanout + -uVar9) >> 0x1e & 1) == 0) {
      uVar6 = 0x40000000;
    }
    *(ulong *)(pFanout + -uVar9) = uVar6 | *(ulong *)(pFanout + -uVar9);
    uVar6 = *(ulong *)(pFanout + -uVar7);
    if (((uint)uVar6 >> 0x1e & 1) == 0) {
      uVar10 = 0x40000000;
    }
    *(ulong *)(pFanout + -uVar7) = uVar10 | uVar6;
    uVar7 = *(ulong *)pFanout;
    *(ulong *)pFanout =
         uVar7 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar7 >> 0x3d) ^ (uint)(uVar6 >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pFanout + -uVar9) >> 0x3f) ^
                (uint)(uVar7 >> 0x1d) & 7)) << 0x3f;
  }
  if (p->fBuiltInSim != 0) {
    uVar7 = *(ulong *)pFanout;
    *(ulong *)pFanout =
         uVar7 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar7 >> 0x3d) ^
                 (uint)((ulong)*(undefined8 *)(pFanout + -(uVar7 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar7 & 0x1fffffff)) >> 0x3f) ^
                (uint)(uVar7 >> 0x1d) & 7)) << 0x3f;
    pGVar2 = p->pObjs;
    if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_008459df;
    Gia_ManBuiltInSimPerform(p,(int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * -0x55555555);
  }
  if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
    Gia_ManQuantSetSuppAnd(p,pFanout);
  }
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pFanout) && (pFanout < pGVar2 + p->nObjs)) {
    uVar4 = (int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * 0x55555556;
LAB_00845994:
    (pObj->field_0).iData = uVar4;
    if ((*(uint *)&pObj->field_0x20 & 0x10) == 0) {
      *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
      return;
    }
    __assert_fail("!Hop_ObjIsMarkA(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x3ad,"void Abc_ConvertAigToGia_rec1(Gia_Man_t *, Hop_Obj_t *)");
  }
LAB_008459df:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Abc_ConvertAigToGia_rec1( Gia_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertAigToGia_rec1( p, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertAigToGia_rec1( p, Hop_ObjFanin1(pObj) );
    pObj->iData = Gia_ManAppendAnd2( p, Hop_ObjChild0CopyI(pObj), Hop_ObjChild1CopyI(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}